

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall
entityx::EventManager::subscribe<entityx::ComponentAddedEvent<A>,entityx::deps::Dependency<A,B,C>>
          (EventManager *this,Dependency<A,_B,_C> *receiver)

{
  int iVar1;
  Family id;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var2;
  undefined4 extraout_var;
  code *pcVar3;
  socklen_t in_ECX;
  sockaddr *__addr;
  EventSignalPtr sig;
  EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> wrapper;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  code *local_b8 [2];
  _Head_base<0UL,_entityx::deps::Dependency<A,_B,_C>_*,_false> _Stack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  function<void_(const_entityx::ComponentAddedEvent<A>_&)> local_88;
  function<void_(const_entityx::ComponentAddedEvent<A>_&)> local_68;
  undefined8 local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined8 local_38;
  
  id = Event<entityx::ComponentAddedEvent<A>_>::family();
  p_Var2 = &signal_for(this,id)->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  Catch::clara::std::
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_c8,p_Var2);
  local_b8[0] = deps::Dependency<A,_B,_C>::receive;
  local_b8[1] = (code *)0x0;
  _Stack_a8._M_head_impl = receiver;
  std::function<void(entityx::ComponentAddedEvent<A>const&)>::
  function<std::_Bind<void(entityx::deps::Dependency<A,B,C>::*(entityx::deps::Dependency<A,B,C>*,std::_Placeholder<1>))(entityx::ComponentAddedEvent<A>const&)>,void>
            ((function<void(entityx::ComponentAddedEvent<A>const&)> *)&local_88,
             (_Bind<void_(entityx::deps::Dependency<A,_B,_C>::*(entityx::deps::Dependency<A,_B,_C>_*,_std::_Placeholder<1>))(const_entityx::ComponentAddedEvent<A>_&)>
              *)local_b8);
  Catch::clara::std::function<void_(const_entityx::ComponentAddedEvent<A>_&)>::function
            (&local_68,&local_88);
  Catch::clara::std::_Function_base::~_Function_base(&local_88.super__Function_base);
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::ComponentAddedEvent<A>>&,void>
            ((function<void(void_const*)> *)local_b8,
             (EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> *)&local_68);
  iVar1 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          connect(&(local_c8._M_ptr)->
                   super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,
                  (int)local_b8,__addr,in_ECX);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)local_b8);
  pcVar3 = (code *)Event<entityx::ComponentAddedEvent<A>_>::family();
  std::
  __weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,(__gnu_cxx::_Lock_policy)2>
  ::__weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,void>
            ((__weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_98,&local_c8);
  local_98 = 0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = 0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8[0] = pcVar3;
  local_a0 = CONCAT44(extraout_var,iVar1);
  local_38 = CONCAT44(extraout_var,iVar1);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&(receiver->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.
                 connections_,local_b8);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_a8);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_40);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_90);
  Catch::clara::std::_Function_base::~_Function_base(&local_68.super__Function_base);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8._M_refcount);
  return;
}

Assistant:

void subscribe(Receiver &receiver) {
    void (Receiver::*receive)(const E &) = &Receiver::receive;
    auto sig = signal_for(Event<E>::family());
    auto wrapper = EventCallbackWrapper<E>(std::bind(receive, &receiver, std::placeholders::_1));
    auto connection = sig->connect(wrapper);
    BaseReceiver &base = receiver;
    base.connections_.insert(std::make_pair(Event<E>::family(), std::make_pair(EventSignalWeakPtr(sig), connection)));
  }